

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldLiteGenerator::GenerateParsingCode
          (ImmutableMessageFieldLiteGenerator *this,Printer *printer)

{
  Type TVar1;
  Printer *printer_local;
  ImmutableMessageFieldLiteGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "$type$.Builder subBuilder = null;\nif ($is_field_present_message$) {\n  subBuilder = $name$_.toBuilder();\n}\n"
                    );
  TVar1 = GetType(this->descriptor_);
  if (TVar1 == TYPE_GROUP) {
    io::Printer::Print(printer,&this->variables_,
                       "$name$_ = input.readGroup($number$, $type$.parser(),\n    extensionRegistry);\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "$name$_ = input.readMessage($type$.parser(), extensionRegistry);\n");
  }
  io::Printer::Print(printer,&this->variables_,
                     "if (subBuilder != null) {\n  subBuilder.mergeFrom($name$_);\n  $name$_ = subBuilder.buildPartial();\n}\n$set_has_field_bit_message$\n"
                    );
  return;
}

Assistant:

void ImmutableMessageFieldLiteGenerator::
GenerateParsingCode(io::Printer* printer) const {
  // TODO(dweis): Update this code to avoid the builder allocation and instead
  // only allocate a submessage that isn't made immutable. Rely on the top
  // message calling makeImmutable once done to actually traverse the tree and
  // finalize state. This will avoid:
  // - transitive builder allocations
  // - the extra transitive iteration for streamed fields
  // - reallocations for copying repeated fields
  printer->Print(variables_,
      "$type$.Builder subBuilder = null;\n"
      "if ($is_field_present_message$) {\n"
      "  subBuilder = $name$_.toBuilder();\n"
      "}\n");

    if (GetType(descriptor_) == FieldDescriptor::TYPE_GROUP) {
      printer->Print(variables_,
        "$name$_ = input.readGroup($number$, $type$.parser(),\n"
        "    extensionRegistry);\n");
    } else {
      printer->Print(variables_,
        "$name$_ = input.readMessage($type$.parser(), extensionRegistry);\n");
    }

  printer->Print(variables_,
    "if (subBuilder != null) {\n"
    "  subBuilder.mergeFrom($name$_);\n"
    "  $name$_ = subBuilder.buildPartial();\n"
    "}\n"
    "$set_has_field_bit_message$\n");
}